

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.cpp
# Opt level: O0

bool __thiscall miniros::Transport::isHostAllowed(Transport *this,string *host)

{
  bool bVar1;
  __type_conflict _Var2;
  ulong uVar3;
  undefined8 uVar4;
  string *in_RSI;
  long in_RDI;
  bool enabled;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  LogLocation *in_stack_ffffffffffffff00;
  LogLocation *in_stack_ffffffffffffff10;
  void *logger_handle;
  undefined4 in_stack_ffffffffffffff18;
  Level LVar5;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Level level;
  string *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  allocator<char> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  byte bVar6;
  undefined1 uVar7;
  allocator<char> local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  byte local_75;
  byte local_62;
  allocator<char> local_61;
  string local_60 [39];
  byte local_39;
  string local_38 [32];
  string *local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x78) & 1) == 0) {
    local_1 = true;
  }
  else {
    local_18 = in_RSI;
    uVar3 = std::__cxx11::string::length();
    local_39 = 0;
    local_62 = 0;
    local_75 = 0;
    bVar6 = false;
    if (3 < uVar3) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)local_18);
      local_39 = 1;
      in_stack_ffffffffffffff38 = &local_61;
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar6,in_stack_ffffffffffffff40),(char *)in_stack_ffffffffffffff38,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      local_75 = 1;
      bVar6 = std::operator==(in_stack_ffffffffffffff20,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    uVar7 = bVar6;
    if ((local_75 & 1) != 0) {
      std::__cxx11::string::~string(local_60);
    }
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator(&local_61);
    }
    if ((local_39 & 1) != 0) {
      std::__cxx11::string::~string(local_38);
    }
    if ((bVar6 & 1) == 0) {
      local_80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffef8);
      while( true ) {
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(in_stack_fffffffffffffef8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffff00,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffef8);
        if (!bVar1) break;
        in_stack_ffffffffffffff28 = local_18;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_80);
        _Var2 = std::operator==(in_stack_ffffffffffffff20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (_Var2) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_80);
      }
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      LVar5 = (Level)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      if (((isHostAllowed::loc.initialized_ ^ 0xffU) & 1) != 0) {
        level = (Level)((ulong)&local_a9 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff40),(char *)in_stack_ffffffffffffff38,
                   (allocator<char> *)CONCAT17(bVar6,in_stack_ffffffffffffff30));
        console::initializeLogLocation
                  ((LogLocation *)CONCAT17(bVar6,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28,level);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator(&local_a9);
      }
      if (isHostAllowed::loc.level_ != Warn) {
        console::setLogLocationLevel(in_stack_ffffffffffffff00,LVar5);
        console::checkLogLocationEnabled(in_stack_ffffffffffffff10);
      }
      if ((isHostAllowed::loc.logger_enabled_ & 1U) != 0) {
        logger_handle = isHostAllowed::loc.logger_;
        LVar5 = isHostAllowed::loc.level_;
        uVar4 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport.cpp"
                       ,0x81,"bool miniros::Transport::isHostAllowed(const std::string &) const",
                       "ROS_HOSTNAME / ROS_IP is set to only allow local connections, so a requested connection to \'%s\' is being rejected."
                       ,uVar4);
      }
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Transport::isHostAllowed(const std::string &host) const
{
  if (!only_localhost_allowed_)
    return true; // doesn't matter; we'll connect to anybody

  if (host.length() >= 4 && host.substr(0, 4) == std::string("127."))
    return true; // ipv4 localhost
  // now, loop through the list of valid hostnames and see if we find it
  for (std::vector<std::string>::const_iterator it = allowed_hosts_.begin(); 
       it != allowed_hosts_.end(); ++it)
  {
    if (host == *it)
      return true; // hooray
  }
  MINIROS_WARN("ROS_HOSTNAME / ROS_IP is set to only allow local connections, so "
           "a requested connection to '%s' is being rejected.", host.c_str());
  return false; // sadness
}